

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O2

bool __thiscall lunasvg::RuleData::isLessThan(RuleData *this,RuleData *rule)

{
  bool bVar1;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_20;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_10;
  
  local_10.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl = &this->m_specificity;
  local_10.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<1UL,_const_unsigned_long_&>.super__Head_base<1UL,_const_unsigned_long_&,_false>.
  _M_head_impl = (_Head_base<1UL,_const_unsigned_long_&,_false>)&this->m_position;
  local_20.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl = &rule->m_specificity;
  local_20.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<1UL,_const_unsigned_long_&>.super__Head_base<1UL,_const_unsigned_long_&,_false>.
  _M_head_impl = (_Head_base<1UL,_const_unsigned_long_&,_false>)&rule->m_position;
  bVar1 = std::
          __tuple_compare<std::tuple<const_unsigned_long_&,_const_unsigned_long_&>,_std::tuple<const_unsigned_long_&,_const_unsigned_long_&>,_0UL,_2UL>
          ::__less(&local_10,&local_20);
  return bVar1;
}

Assistant:

bool isLessThan(const RuleData& rule) const { return std::tie(m_specificity, m_position) < std::tie(rule.m_specificity, rule.m_position); }